

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O1

void decode_token_recon_block(AV1Decoder *pbi,ThreadData *td,aom_reader *r,BLOCK_SIZE bsize)

{
  AV1_COMMON *cm;
  BLOCK_SIZE plane_bsize;
  int iVar1;
  int iVar2;
  MB_MODE_INFO *pMVar3;
  uint blk_col;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  byte bVar8;
  byte bVar9;
  ushort uVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  ulong uVar19;
  int iVar20;
  uint uVar21;
  int iVar22;
  int plane;
  uint blk_row;
  int eobtotal;
  ulong local_40;
  AV1Decoder *local_38;
  
  cm = &pbi->common;
  uVar16 = (uint)(((pbi->common).seq_params)->monochrome == '\0') * 2 + 1;
  pMVar3 = *(td->dcb).xd.mi;
  local_38 = pbi;
  if (((pMVar3->field_0xa7 & 0x80) == 0) && (pMVar3->ref_frame[0] < '\x01')) {
    uVar13 = (uint)block_size_wide[bsize];
    iVar15 = (td->dcb).xd.mb_to_right_edge;
    if (iVar15 < 0) {
      uVar13 = (uint)block_size_wide[bsize] +
               (iVar15 >> ((char)(td->dcb).xd.plane[0].subsampling_x + 3U & 0x1f));
    }
    uVar13 = (int)uVar13 >> 2;
    uVar17 = (uint)block_size_high[bsize];
    iVar15 = (td->dcb).xd.mb_to_bottom_edge;
    if (iVar15 < 0) {
      uVar17 = (uint)block_size_high[bsize] +
               (iVar15 >> ((char)(td->dcb).xd.plane[0].subsampling_y + 3U & 0x1f));
    }
    iVar15 = (int)uVar17 >> 2;
    uVar17 = 0x10;
    if ((int)uVar13 < 0x10) {
      uVar17 = uVar13;
    }
    iVar20 = 0x10;
    if (iVar15 < 0x10) {
      iVar20 = iVar15;
    }
    if (0 < iVar15) {
      uVar7 = 0;
      do {
        if (0 < (int)uVar13) {
          iVar12 = uVar7 + iVar20;
          if (iVar15 <= (int)(uVar7 + iVar20)) {
            iVar12 = iVar15;
          }
          uVar5 = 0;
          do {
            uVar6 = uVar17 + uVar5;
            uVar11 = uVar13;
            if ((int)uVar6 < (int)uVar13) {
              uVar11 = uVar6;
            }
            uVar19 = 0;
            do {
              if ((uVar19 != 0) && ((td->dcb).xd.is_chroma_ref != true)) break;
              pMVar3 = *(td->dcb).xd.mi;
              if ((td->dcb).xd.lossless[*(ushort *)&pMVar3->field_0xa7 & 7] == 0) {
                if (uVar19 == 0) {
                  uVar14 = (uint)pMVar3->tx_size;
                }
                else {
                  bVar8 = ""[av1_ss_size_lookup[pMVar3->bsize]
                             [(td->dcb).xd.plane[uVar19].subsampling_x]
                             [(td->dcb).xd.plane[uVar19].subsampling_y]];
                  if (bVar8 < 0x11) {
                    uVar14 = 3;
                    if ((1 < bVar8 - 0xb) && (bVar8 != 4)) {
LAB_0017135f:
                      uVar14 = (uint)bVar8;
                    }
                  }
                  else if (bVar8 == 0x11) {
                    uVar14 = 9;
                  }
                  else {
                    if (bVar8 != 0x12) goto LAB_0017135f;
                    uVar14 = 10;
                  }
                }
              }
              else {
                uVar14 = 0;
              }
              bVar8 = (byte)(td->dcb).xd.plane[uVar19].subsampling_y;
              bVar9 = (byte)(td->dcb).xd.plane[uVar19].subsampling_x;
              iVar22 = ((1 << (bVar8 & 0x1f)) >> 1) + iVar12 >> (bVar8 & 0x1f);
              uVar4 = uVar7 >> (bVar8 & 0x1f);
              if ((int)uVar4 < iVar22) {
                iVar1 = *(int *)((long)tx_size_high_unit + (ulong)(uVar14 << 2));
                iVar2 = *(int *)((long)tx_size_wide_unit + (ulong)(uVar14 << 2));
                do {
                  for (uVar18 = uVar5 >> ((byte)(td->dcb).xd.plane[uVar19].subsampling_x & 0x1f);
                      (int)uVar18 < (int)(((1 << (bVar9 & 0x1f)) >> 1) + uVar11) >> (bVar9 & 0x1f);
                      uVar18 = uVar18 + iVar2) {
                    (*td->read_coeffs_tx_intra_block_visit)
                              (cm,&td->dcb,r,(int)uVar19,uVar4,uVar18,(TX_SIZE)uVar14);
                    (*td->predict_and_recon_intra_block_visit)
                              (cm,&td->dcb,r,(int)uVar19,uVar4,uVar18,(TX_SIZE)uVar14);
                    uVar10 = (short)*(undefined4 *)((long)tx_size_high + (ulong)(uVar14 * 4)) *
                             (short)*(undefined4 *)((long)tx_size_wide + (ulong)(uVar14 * 4)) +
                             (td->dcb).cb_offset[uVar19];
                    (td->dcb).cb_offset[uVar19] = uVar10;
                    (td->dcb).txb_offset[uVar19] = uVar10 >> 4;
                  }
                  uVar4 = uVar4 + iVar1;
                } while ((int)uVar4 < iVar22);
              }
              uVar19 = uVar19 + 1;
            } while (uVar19 != uVar16);
            uVar5 = uVar6;
          } while ((int)uVar6 < (int)uVar13);
        }
        uVar7 = uVar7 + iVar20;
      } while ((int)uVar7 < iVar15);
    }
  }
  else {
    (*td->predict_inter_block_visit)(cm,&td->dcb,bsize);
    if (pMVar3->skip_txfm == '\0') {
      eobtotal = 0;
      uVar13 = (uint)block_size_wide[bsize];
      iVar15 = (td->dcb).xd.mb_to_right_edge;
      if (iVar15 < 0) {
        uVar13 = (uint)block_size_wide[bsize] +
                 (iVar15 >> ((char)(td->dcb).xd.plane[0].subsampling_x + 3U & 0x1f));
      }
      uVar13 = (int)uVar13 >> 2;
      uVar17 = (uint)block_size_high[bsize];
      iVar15 = (td->dcb).xd.mb_to_bottom_edge;
      if (iVar15 < 0) {
        uVar17 = (uint)block_size_high[bsize] +
                 (iVar15 >> ((char)(td->dcb).xd.plane[0].subsampling_y + 3U & 0x1f));
      }
      uVar17 = (int)uVar17 >> 2;
      uVar7 = 0x10;
      if ((int)uVar13 < 0x10) {
        uVar7 = uVar13;
      }
      uVar5 = 0x10;
      if ((int)uVar17 < 0x10) {
        uVar5 = uVar17;
      }
      local_40 = (ulong)uVar5;
      if (0 < (int)uVar17) {
        uVar5 = 0;
        do {
          if (0 < (int)uVar13) {
            uVar11 = uVar5 + (int)local_40;
            if ((int)uVar17 <= (int)uVar11) {
              uVar11 = uVar17;
            }
            uVar6 = 0;
            do {
              uVar4 = uVar7 + uVar6;
              uVar14 = uVar13;
              if ((int)uVar4 < (int)uVar13) {
                uVar14 = uVar4;
              }
              uVar19 = 0;
              do {
                if ((uVar19 != 0) && ((td->dcb).xd.is_chroma_ref != true)) break;
                iVar15 = (td->dcb).xd.plane[uVar19].subsampling_x;
                iVar20 = (td->dcb).xd.plane[uVar19].subsampling_y;
                plane_bsize = av1_ss_size_lookup[bsize][iVar15][iVar20];
                uVar18 = 0;
                if ((td->dcb).xd.lossless[*(ushort *)&(*(td->dcb).xd.mi)->field_0xa7 & 7] == 0) {
                  bVar8 = ""[plane_bsize];
                  if (uVar19 == 0) {
LAB_00170e97:
                    bVar9 = bVar8;
                  }
                  else if (bVar8 < 0x11) {
                    bVar9 = 3;
                    if ((1 < bVar8 - 0xb) && (bVar8 != 4)) goto LAB_00170e97;
                  }
                  else if (bVar8 == 0x11) {
                    bVar9 = 9;
                  }
                  else {
                    if (bVar8 != 0x12) goto LAB_00170e97;
                    bVar9 = 10;
                  }
                  uVar18 = (uint)bVar9;
                }
                bVar8 = (byte)iVar20;
                iVar20 = (int)(((1 << (bVar8 & 0x1f)) >> 1) + uVar11) >> (bVar8 & 0x1f);
                bVar9 = (byte)iVar15;
                blk_row = uVar5 >> (bVar8 & 0x1f);
                if ((int)blk_row < iVar20) {
                  iVar15 = *(int *)((long)tx_size_high_unit + (ulong)(uVar18 << 2));
                  iVar12 = *(int *)((long)tx_size_wide_unit + (ulong)(uVar18 << 2));
                  uVar21 = uVar6 >> (bVar9 & 0x1f);
                  iVar22 = 0;
                  blk_col = uVar21;
                  do {
                    for (; (int)blk_col <
                           (int)(((1 << (bVar9 & 0x1f)) >> 1) + uVar14) >> (bVar9 & 0x1f);
                        blk_col = blk_col + iVar12) {
                      decode_reconstruct_tx
                                (cm,td,r,pMVar3,(int)uVar19,plane_bsize,blk_row,blk_col,iVar22,
                                 (TX_SIZE)uVar18,&eobtotal);
                      iVar22 = iVar22 + iVar12 * iVar15;
                    }
                    blk_row = blk_row + iVar15;
                    blk_col = uVar21;
                  } while ((int)blk_row < iVar20);
                }
                uVar19 = uVar19 + 1;
              } while (uVar19 != uVar16);
              uVar6 = uVar4;
            } while ((int)uVar4 < (int)uVar13);
          }
          uVar5 = uVar5 + (int)local_40;
        } while ((int)uVar5 < (int)uVar17);
      }
    }
    (*td->cfl_store_inter_block_visit)(cm,(MACROBLOCKD *)td);
  }
  av1_visit_palette(local_38,(MACROBLOCKD *)td,r,set_color_index_map_offset);
  return;
}

Assistant:

static inline void decode_token_recon_block(AV1Decoder *const pbi,
                                            ThreadData *const td, aom_reader *r,
                                            BLOCK_SIZE bsize) {
  AV1_COMMON *const cm = &pbi->common;
  DecoderCodingBlock *const dcb = &td->dcb;
  MACROBLOCKD *const xd = &dcb->xd;
  const int num_planes = av1_num_planes(cm);
  MB_MODE_INFO *mbmi = xd->mi[0];

  if (!is_inter_block(mbmi)) {
    int row, col;
    assert(bsize == get_plane_block_size(bsize, xd->plane[0].subsampling_x,
                                         xd->plane[0].subsampling_y));
    const int max_blocks_wide = max_block_wide(xd, bsize, 0);
    const int max_blocks_high = max_block_high(xd, bsize, 0);
    const BLOCK_SIZE max_unit_bsize = BLOCK_64X64;
    int mu_blocks_wide = mi_size_wide[max_unit_bsize];
    int mu_blocks_high = mi_size_high[max_unit_bsize];
    mu_blocks_wide = AOMMIN(max_blocks_wide, mu_blocks_wide);
    mu_blocks_high = AOMMIN(max_blocks_high, mu_blocks_high);

    for (row = 0; row < max_blocks_high; row += mu_blocks_high) {
      for (col = 0; col < max_blocks_wide; col += mu_blocks_wide) {
        for (int plane = 0; plane < num_planes; ++plane) {
          if (plane && !xd->is_chroma_ref) break;
          const struct macroblockd_plane *const pd = &xd->plane[plane];
          const TX_SIZE tx_size = av1_get_tx_size(plane, xd);
          const int stepr = tx_size_high_unit[tx_size];
          const int stepc = tx_size_wide_unit[tx_size];

          const int unit_height = ROUND_POWER_OF_TWO(
              AOMMIN(mu_blocks_high + row, max_blocks_high), pd->subsampling_y);
          const int unit_width = ROUND_POWER_OF_TWO(
              AOMMIN(mu_blocks_wide + col, max_blocks_wide), pd->subsampling_x);

          for (int blk_row = row >> pd->subsampling_y; blk_row < unit_height;
               blk_row += stepr) {
            for (int blk_col = col >> pd->subsampling_x; blk_col < unit_width;
                 blk_col += stepc) {
              td->read_coeffs_tx_intra_block_visit(cm, dcb, r, plane, blk_row,
                                                   blk_col, tx_size);
              td->predict_and_recon_intra_block_visit(
                  cm, dcb, r, plane, blk_row, blk_col, tx_size);
              set_cb_buffer_offsets(dcb, tx_size, plane);
            }
          }
        }
      }
    }
  } else {
    td->predict_inter_block_visit(cm, dcb, bsize);
    // Reconstruction
    if (!mbmi->skip_txfm) {
      int eobtotal = 0;

      const int max_blocks_wide = max_block_wide(xd, bsize, 0);
      const int max_blocks_high = max_block_high(xd, bsize, 0);
      int row, col;

      const BLOCK_SIZE max_unit_bsize = BLOCK_64X64;
      assert(max_unit_bsize ==
             get_plane_block_size(BLOCK_64X64, xd->plane[0].subsampling_x,
                                  xd->plane[0].subsampling_y));
      int mu_blocks_wide = mi_size_wide[max_unit_bsize];
      int mu_blocks_high = mi_size_high[max_unit_bsize];

      mu_blocks_wide = AOMMIN(max_blocks_wide, mu_blocks_wide);
      mu_blocks_high = AOMMIN(max_blocks_high, mu_blocks_high);

      for (row = 0; row < max_blocks_high; row += mu_blocks_high) {
        for (col = 0; col < max_blocks_wide; col += mu_blocks_wide) {
          for (int plane = 0; plane < num_planes; ++plane) {
            if (plane && !xd->is_chroma_ref) break;
            const struct macroblockd_plane *const pd = &xd->plane[plane];
            const int ss_x = pd->subsampling_x;
            const int ss_y = pd->subsampling_y;
            const BLOCK_SIZE plane_bsize =
                get_plane_block_size(bsize, ss_x, ss_y);
            const TX_SIZE max_tx_size =
                get_vartx_max_txsize(xd, plane_bsize, plane);
            const int bh_var_tx = tx_size_high_unit[max_tx_size];
            const int bw_var_tx = tx_size_wide_unit[max_tx_size];
            int block = 0;
            int step =
                tx_size_wide_unit[max_tx_size] * tx_size_high_unit[max_tx_size];
            int blk_row, blk_col;
            const int unit_height = ROUND_POWER_OF_TWO(
                AOMMIN(mu_blocks_high + row, max_blocks_high), ss_y);
            const int unit_width = ROUND_POWER_OF_TWO(
                AOMMIN(mu_blocks_wide + col, max_blocks_wide), ss_x);

            for (blk_row = row >> ss_y; blk_row < unit_height;
                 blk_row += bh_var_tx) {
              for (blk_col = col >> ss_x; blk_col < unit_width;
                   blk_col += bw_var_tx) {
                decode_reconstruct_tx(cm, td, r, mbmi, plane, plane_bsize,
                                      blk_row, blk_col, block, max_tx_size,
                                      &eobtotal);
                block += step;
              }
            }
          }
        }
      }
    }
    td->cfl_store_inter_block_visit(cm, xd);
  }

  av1_visit_palette(pbi, xd, r, set_color_index_map_offset);
}